

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_set_time(spng_ctx *ctx,spng_time *time)

{
  int iVar1;
  int ret;
  spng_time *time_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (time == (spng_time *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->data == (uchar *)0x0) && ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0)) {
    ctx_local._4_4_ = 0x52;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      iVar1 = check_time(time);
      if (iVar1 == 0) {
        ctx->time = *time;
        ctx->stored = (spng_chunk_bitfield)((uint)ctx->stored & 0xffffdfff | 0x2000);
        ctx->user = (spng_chunk_bitfield)((uint)ctx->user & 0xffffdfff | 0x2000);
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = 0x3b;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_set_time(spng_ctx *ctx, struct spng_time *time)
{
    SPNG_SET_CHUNK_BOILERPLATE(time);

    if(check_time(time)) return SPNG_ETIME;

    ctx->time = *time;

    ctx->stored.time = 1;
    ctx->user.time = 1;

    return 0;
}